

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O2

void __thiscall GLPortal::ClearClipper(GLPortal *this)

{
  GLWall *pGVar1;
  double dVar2;
  angle_t aVar3;
  uint i;
  ulong uVar4;
  long lVar5;
  int iVar6;
  TVector2<double> local_60;
  double local_50;
  undefined1 local_48 [16];
  
  local_60.Y = (double)SUB84((ViewAngle.Degrees - (this->savedAngle).Degrees) * 11930464.711111112 +
                             6755399441055744.0,0) * 8.381903171539307e-08;
  Clipper::Clear(&clipper);
  Clipper::AddClipRange(&clipper,0,0xffffffff);
  lVar5 = 8;
  for (uVar4 = 0; uVar4 < (this->lines).Count; uVar4 = uVar4 + 1) {
    pGVar1 = (this->lines).Array;
    dVar2 = (double)*(float *)((long)pGVar1->vertexes + lVar5 + -0x14) - (this->savedViewPos).Y;
    local_48._8_4_ = SUB84(dVar2,0);
    local_48._0_8_ =
         (double)*(float *)((long)pGVar1->vertexes + lVar5 + -0x1c) - (this->savedViewPos).X;
    local_48._12_4_ = (int)((ulong)dVar2 >> 0x20);
    TVector2<double>::Angle(&local_60);
    pGVar1 = (this->lines).Array;
    local_50 = local_60.X;
    dVar2 = (double)*(float *)((long)pGVar1->vertexes + lVar5 + -0x18) - (this->savedViewPos).Y;
    local_48._8_4_ = SUB84(dVar2,0);
    local_48._0_8_ =
         (double)*(float *)((long)pGVar1->vertexes + lVar5 + -0x20) - (this->savedViewPos).X;
    local_48._12_4_ = (int)((ulong)dVar2 >> 0x20);
    TVector2<double>::Angle(&local_60);
    if ((double)SUB84((local_50 - local_60.X) * 11930464.711111112 + 6755399441055744.0,0) *
        8.381903171539307e-08 < 0.0) {
      Clipper::SafeRemoveClipRangeRealAngles
                (&clipper,SUB84((local_50 + local_60.Y) * 11930464.711111112 + 6755399441055744.0,0)
                 ,SUB84((local_60.X + local_60.Y) * 11930464.711111112 + 6755399441055744.0,0));
    }
    lVar5 = lVar5 + 0x140;
  }
  aVar3 = FGLRenderer::FrustumAngle(GLRenderer);
  if (-1 < (int)aVar3) {
    iVar6 = SUB84(ViewAngle.Degrees * 11930464.711111112 + 6755399441055744.0,0);
    Clipper::SafeAddClipRangeRealAngles(&clipper,aVar3 + iVar6,iVar6 - aVar3);
  }
  Clipper::SetSilhouette(&clipper);
  return;
}

Assistant:

inline void GLPortal::ClearClipper()
{
	DAngle angleOffset = deltaangle(savedAngle, ViewAngle);

	clipper.Clear();

	static int call=0;

	// Set the clipper to the minimal visible area
	clipper.SafeAddClipRange(0,0xffffffff);
	for (unsigned int i = 0; i < lines.Size(); i++)
	{
		DAngle startAngle = (DVector2(lines[i].glseg.x2, lines[i].glseg.y2) - savedViewPos).Angle() + angleOffset;
		DAngle endAngle = (DVector2(lines[i].glseg.x1, lines[i].glseg.y1) - savedViewPos).Angle() + angleOffset;

		if (deltaangle(endAngle, startAngle) < 0)
		{
			clipper.SafeRemoveClipRangeRealAngles(startAngle.BAMs(), endAngle.BAMs());
		}
	}

	// and finally clip it to the visible area
	angle_t a1 = GLRenderer->FrustumAngle();
	if (a1 < ANGLE_180) clipper.SafeAddClipRangeRealAngles(ViewAngle.BAMs() + a1, ViewAngle.BAMs() - a1);

	// lock the parts that have just been clipped out.
	clipper.SetSilhouette();
}